

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool do_adr(DisasContext_conflict1 *s,arg_rrri *a,undefined1 *fn)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 uVar1;
  undefined1 extraout_AL;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = sve_access_check_aarch64(s);
  if ((bool)uVar1) {
    tcg_gen_gvec_3_ool_aarch64
              (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,s->sve_len,
               s->sve_len,a->imm,(gen_helper_gvec_3_conflict1 *)fn);
    uVar1 = extraout_AL;
  }
  return (_Bool)uVar1;
}

Assistant:

static bool do_adr(DisasContext *s, arg_rrri *a, gen_helper_gvec_3 *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           vsz, vsz, a->imm, fn);
    }
    return true;
}